

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderhacks.cpp
# Opt level: O1

void __thiscall
FDrawInfo::AddOtherCeilingPlane(FDrawInfo *this,int sector,gl_subsectorrendernode *node)

{
  uint uVar1;
  gl_subsectorrendernode **ppgVar2;
  int iVar3;
  long lVar4;
  TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*> *this_00;
  
  uVar1 = (this->otherceilingplanes).Count;
  lVar4 = (long)(int)uVar1;
  this_00 = &this->otherceilingplanes;
  if ((int)uVar1 <= sector) {
    TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*>::Resize(this_00,sector + 1U);
    iVar3 = (sector + 1U) - uVar1;
    do {
      this_00->Array[lVar4] = (gl_subsectorrendernode *)0x0;
      lVar4 = lVar4 + 1;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  ppgVar2 = this_00->Array;
  node->next = ppgVar2[sector];
  ppgVar2[sector] = node;
  return;
}

Assistant:

void FDrawInfo::AddOtherCeilingPlane(int sector, gl_subsectorrendernode * node)
{
	int oldcnt = otherceilingplanes.Size();

	if (oldcnt<=sector)
	{
		otherceilingplanes.Resize(sector+1);
		for(int i=oldcnt;i<=sector;i++) otherceilingplanes[i]=NULL;
	}
	node->next = otherceilingplanes[sector];
	otherceilingplanes[sector] = node;
}